

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O3

iterator __thiscall
QMultiMap<QSsl::AlternativeNameEntryType,_QString>::insert
          (QMultiMap<QSsl::AlternativeNameEntryType,_QString> *this,AlternativeNameEntryType *key,
          QString *value)

{
  QMapData<std::multimap<QSsl::AlternativeNameEntryType,_QString,_std::less<QSsl::AlternativeNameEntryType>,_std::allocator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>_>_>
  *pQVar1;
  iterator iVar2;
  _Base_ptr p_Var3;
  const_iterator __position;
  long in_FS_OFFSET;
  pair<const_QSsl::AlternativeNameEntryType,_QString> local_50;
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<QSsl::AlternativeNameEntryType,_QString,_std::less<QSsl::AlternativeNameEntryType>,_std::allocator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>_>_>_>
  local_30;
  _Alloc_node local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.d.ptr =
       (totally_ordered_wrapper<QMapData<std::multimap<QSsl::AlternativeNameEntryType,_QString,_std::less<QSsl::AlternativeNameEntryType>,_std::allocator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>_>_>_*>
        )(this->d).d.ptr;
  if ((local_30.d.ptr ==
       (QMapData<std::multimap<QSsl::AlternativeNameEntryType,_QString,_std::less<QSsl::AlternativeNameEntryType>,_std::allocator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>_>_>
        *)0x0) ||
     ((__atomic_base<int>)
      *(__int_type *)
       &(((QMapData<std::multimap<QSsl::AlternativeNameEntryType,_QString,_std::less<QSsl::AlternativeNameEntryType>,_std::allocator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>_>_>
           *)local_30.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x1)) {
    local_30.d.ptr =
         (totally_ordered_wrapper<QMapData<std::multimap<QSsl::AlternativeNameEntryType,_QString,_std::less<QSsl::AlternativeNameEntryType>,_std::allocator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>_>_>_*>
          )(QMapData<std::multimap<QSsl::AlternativeNameEntryType,_QString,_std::less<QSsl::AlternativeNameEntryType>,_std::allocator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>_>_>
            *)0x0;
  }
  else {
    LOCK();
    (((QMapData<std::multimap<QSsl::AlternativeNameEntryType,_QString,_std::less<QSsl::AlternativeNameEntryType>,_std::allocator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>_>_>
       *)local_30.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((QMapData<std::multimap<QSsl::AlternativeNameEntryType,_QString,_std::less<QSsl::AlternativeNameEntryType>,_std::allocator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>_>_>
                        *)local_30.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  detach(this);
  pQVar1 = (this->d).d.ptr;
  __position._M_node = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_50.first = *key;
  for (p_Var3 = *(_Base_ptr *)((long)&(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header + 8);
      p_Var3 != (_Base_ptr)0x0;
      p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < (int)local_50.first]) {
    if ((int)local_50.first <= (int)p_Var3[1]._M_color) {
      __position._M_node = p_Var3;
    }
  }
  local_28._M_t = &(pQVar1->m)._M_t;
  local_50.second.d.d = (value->d).d;
  local_50.second.d.ptr = (value->d).ptr;
  local_50.second.d.size = (value->d).size;
  if (&(local_50.second.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_50.second.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_50.second.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  iVar2 = std::
          _Rb_tree<QSsl::AlternativeNameEntryType,std::pair<QSsl::AlternativeNameEntryType_const,QString>,std::_Select1st<std::pair<QSsl::AlternativeNameEntryType_const,QString>>,std::less<QSsl::AlternativeNameEntryType>,std::allocator<std::pair<QSsl::AlternativeNameEntryType_const,QString>>>
          ::
          _M_insert_equal_<std::pair<QSsl::AlternativeNameEntryType_const,QString>,std::_Rb_tree<QSsl::AlternativeNameEntryType,std::pair<QSsl::AlternativeNameEntryType_const,QString>,std::_Select1st<std::pair<QSsl::AlternativeNameEntryType_const,QString>>,std::less<QSsl::AlternativeNameEntryType>,std::allocator<std::pair<QSsl::AlternativeNameEntryType_const,QString>>>::_Alloc_node>
                    ((_Rb_tree<QSsl::AlternativeNameEntryType,std::pair<QSsl::AlternativeNameEntryType_const,QString>,std::_Select1st<std::pair<QSsl::AlternativeNameEntryType_const,QString>>,std::less<QSsl::AlternativeNameEntryType>,std::allocator<std::pair<QSsl::AlternativeNameEntryType_const,QString>>>
                      *)local_28._M_t,__position,&local_50,&local_28);
  if (&(local_50.second.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.second.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.second.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.second.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_50.second.d.d)->super_QArrayData,2,0x10);
    }
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<QSsl::AlternativeNameEntryType,_QString,_std::less<QSsl::AlternativeNameEntryType>,_std::allocator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)(iterator)iVar2._M_node;
  }
  __stack_chk_fail();
}

Assistant:

iterator insert(const Key &key, const T &value)
    {
        const auto copy = d.isShared() ? *this : QMultiMap(); // keep `key`/`value` alive across the detach
        detach();
        // note that std::multimap inserts at the end of an equal_range for a key,
        // QMultiMap at the beginning.
        auto i = d->m.lower_bound(key);
        return iterator(d->m.insert(i, {key, value}));
    }